

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

bool __thiscall minja::Value::get<bool>(Value *this,string *key,bool default_value)

{
  bool bVar1;
  byte in_DL;
  Value *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  string *in_stack_ffffffffffffff88;
  Value *in_stack_ffffffffffffff90;
  Value *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffc0;
  Value *in_stack_ffffffffffffffc8;
  undefined1 local_1;
  
  local_1 = (bool)(in_DL & 1);
  bVar1 = contains(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (bVar1) {
    Value(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    at((Value *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
       in_stack_ffffffffffffff58);
    local_1 = get<bool>(in_stack_ffffffffffffffb0);
    ~Value((Value *)CONCAT17(local_1,in_stack_ffffffffffffff60));
  }
  return local_1;
}

Assistant:

T get(const std::string & key, T default_value) const {
    if (!contains(key)) return default_value;
    return at(key).get<T>();
  }